

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmMove8<(moira::Instr)71,(moira::Mode)0,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char *pcVar1;
  byte *pbVar2;
  StrWriter *pSVar3;
  Ea<(moira::Mode)8,_(moira::Size)2> dst;
  Ea<(moira::Mode)8,_(moira::Size)2> local_34;
  
  Op<(moira::Mode)8,(moira::Size)2>(&local_34,this,op >> 9 & 7,addr);
  pSVar3 = StrWriter::operator<<(str);
  pSVar3 = StrWriter::operator<<(pSVar3);
  StrWriter::operator<<(pSVar3,(Align)(this->tab).raw);
  pcVar1 = pSVar3->ptr;
  pSVar3->ptr = pcVar1 + 1;
  *pcVar1 = 'D';
  pbVar2 = (byte *)pSVar3->ptr;
  pSVar3->ptr = (char *)(pbVar2 + 1);
  *pbVar2 = (byte)op & 7 | 0x30;
  StrWriter::operator<<(pSVar3,", ");
  StrWriter::operator<<(pSVar3,&local_34);
  return;
}

Assistant:

void
Moira::dasmMove8(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S>       ( _____________xxx(op), addr );
    auto dst = Op <MODE_AL,S> ( ____xxx_________(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}